

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgShader.cpp
# Opt level: O0

void __thiscall rsg::Function::Function(Function *this,char *name)

{
  allocator<char> local_19;
  char *local_18;
  char *name_local;
  Function *this_local;
  
  local_18 = name;
  name_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)this,name,&local_19);
  std::allocator<char>::~allocator(&local_19);
  std::vector<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>::vector(&this->m_parameters);
  VariableType::VariableType(&this->m_returnType);
  BlockStatement::BlockStatement(&this->m_functionBlock);
  return;
}

Assistant:

Function::Function (const char* name)
	: m_name(name)
{
}